

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaJsonWriter::BeginString(VmaJsonWriter *this,char *pStr)

{
  VmaVector<char,_VmaStlAllocator<char>_> *this_00;
  size_t sVar1;
  
  BeginValue(this,false);
  this_00 = &this->m_SB->m_Data;
  sVar1 = this_00->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(this_00,sVar1 + 1);
  this_00->m_pArray[sVar1] = '\"';
  this->m_InsideString = true;
  if ((pStr != (char *)0x0) && (*pStr != '\0')) {
    ContinueString(this,pStr);
    return;
  }
  return;
}

Assistant:

void VmaJsonWriter::BeginString(const char* pStr)
{
    VMA_ASSERT(!m_InsideString);

    BeginValue(true);
    m_SB.Add('"');
    m_InsideString = true;
    if (pStr != VMA_NULL && pStr[0] != '\0')
    {
        ContinueString(pStr);
    }
}